

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image.cpp
# Opt level: O0

integral_image * create_integral_img(int width,int height)

{
  integral_image *piVar1;
  float *pfVar2;
  int in_ESI;
  int in_EDI;
  integral_image *iimage;
  
  piVar1 = (integral_image *)malloc(0x20);
  piVar1->width = in_EDI;
  piVar1->height = in_ESI;
  piVar1->data_width = in_EDI;
  piVar1->data_height = in_ESI;
  pfVar2 = (float *)malloc((long)(in_EDI * in_ESI) << 2);
  piVar1->padded_data = pfVar2;
  piVar1->data = piVar1->padded_data;
  return piVar1;
}

Assistant:

struct integral_image *create_integral_img(int width, int height) {
    
    // Allocating memory to integral image that is returned
    struct integral_image *iimage = (struct integral_image *)malloc(sizeof(struct integral_image));
    
    // Setting real image width and height
    iimage->width = width;
    iimage->height = height;
    
    // Setting data width and height to be same as normal width and height
    // since this integral image has no padding
    iimage->data_width = width;
    iimage->data_height = height;

    // Allocating data for storing values of integral image
    iimage->padded_data = (float *)malloc(width * height * sizeof(float));
    
    // Setting data and padded data to be equal since this integral image has no padding
    iimage->data = iimage->padded_data;

    return iimage;

}